

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  byte bVar1;
  short sVar2;
  ushort *puVar3;
  FT_GlyphSlot pFVar4;
  TT_ExecContext pTVar5;
  FT_Byte *__dest;
  bool bVar6;
  ushort *puVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  ushort *puVar11;
  FT_Vector *pFVar12;
  FT_Vector *pFVar13;
  ushort uVar14;
  long lVar15;
  byte *__s;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  FT_GlyphLoader pFVar19;
  FT_Error FVar20;
  byte *pbVar21;
  byte *pbVar22;
  int iVar23;
  byte *pbVar24;
  FT_UInt n_contours;
  ulong local_68;
  FT_ULong tmp;
  byte *local_58;
  byte *local_50;
  ulong local_48;
  FT_GlyphLoader local_40;
  ulong local_38;
  
  pFVar19 = load->gloader;
  pbVar24 = load->cursor;
  pbVar18 = load->limit;
  sVar2 = load->n_contours;
  n_contours = (FT_UInt)sVar2;
  iVar9 = 0;
  if ((sVar2 != 0) &&
     (iVar9 = 0,
     pFVar19->max_contours <
     (int)(pFVar19->base).outline.n_contours + n_contours +
     (int)(pFVar19->current).outline.n_contours)) {
    iVar9 = FT_GlyphLoader_CheckPoints(pFVar19,0,n_contours);
  }
  if (iVar9 != 0) {
    return iVar9;
  }
  if (0xffe < sVar2) {
    return 0x14;
  }
  if (pbVar18 < pbVar24 + (long)(int)n_contours * 2 + 2) {
    return 0x14;
  }
  puVar3 = (ushort *)(pFVar19->current).outline.contours;
  bVar1 = *pbVar24;
  uVar8 = CONCAT11(bVar1,pbVar24[1]);
  if (0 < sVar2) {
    *puVar3 = uVar8;
  }
  if ((short)((ushort)bVar1 << 8) < 0) {
    return 0x14;
  }
  pbVar21 = pbVar24 + 4;
  pbVar24 = pbVar18 + (-4 - (long)pbVar24);
  puVar7 = puVar3;
  while (puVar11 = puVar7 + 1, puVar11 < puVar3 + (int)n_contours) {
    uVar14 = *(ushort *)(pbVar21 + -2) << 8 | *(ushort *)(pbVar21 + -2) >> 8;
    *puVar11 = uVar14;
    pbVar21 = pbVar21 + 2;
    pbVar24 = pbVar24 + -2;
    bVar6 = (short)uVar14 <= (short)uVar8;
    puVar7 = puVar11;
    uVar8 = uVar14;
    if (bVar6) {
      return 0x14;
    }
  }
  FVar20 = 0;
  local_38 = 0;
  if (0 < sVar2) {
    if ((short)*puVar7 < -1) {
      return 0x14;
    }
    local_38 = (ulong)((int)(short)*puVar7 + 1);
  }
  local_40 = pFVar19;
  if (pFVar19->max_points <
      (uint)((int)(pFVar19->base).outline.n_points + (int)local_38 + 4 +
            (int)(pFVar19->current).outline.n_points)) {
    FVar20 = FT_GlyphLoader_CheckPoints(pFVar19,(int)local_38 + 4,0);
  }
  if (FVar20 != 0) {
    return FVar20;
  }
  pFVar4 = load->glyph;
  pFVar4->control_data = (void *)0x0;
  pFVar4->control_len = 0;
  if (pbVar21 <= pbVar18) {
    tmp = (ulong)pbVar21[-2] << 8;
    iVar9 = (int)tmp;
    bVar1 = pbVar21[-1];
    local_50 = (byte *)(ulong)bVar1;
    uVar10 = (uint)bVar1;
    if ((load->load_flags & 2) == 0) {
      uVar17 = (ulong)(ushort)(iVar9 + (uint)bVar1);
      local_58 = pbVar18;
      if ((long)pbVar24 < (long)uVar17) {
        FVar20 = 0x16;
        iVar23 = 2;
        uVar10 = (uint)bVar1;
      }
      else {
        local_48 = CONCAT44(local_48._4_4_,iVar9 + (uint)bVar1);
        pTVar5 = load->exec;
        local_68 = (ulong)pTVar5->glyphSize;
        FVar20 = Update_Max(pTVar5->memory,&local_68,1,&pTVar5->glyphIns,uVar17);
        pTVar5 = load->exec;
        pTVar5->glyphSize = (uint)(ushort)local_68;
        if (FVar20 == 0) {
          pFVar4 = load->glyph;
          pFVar4->control_len = uVar17;
          __dest = pTVar5->glyphIns;
          pFVar4->control_data = __dest;
          iVar23 = 0;
          if ((short)local_48 != 0) {
            memcpy(__dest,pbVar21,uVar17);
          }
          FVar20 = 0;
        }
        else {
          iVar23 = 1;
        }
        iVar9 = (int)tmp;
        uVar10 = (uint)local_50;
      }
      if (iVar23 == 2) {
        return FVar20;
      }
      pbVar18 = local_58;
      pFVar19 = local_40;
      if (iVar23 != 0) {
        return FVar20;
      }
    }
    else {
      FVar20 = 0;
      pFVar19 = local_40;
    }
    pbVar21 = pbVar21 + ((uVar10 & 0xffff) + iVar9 & 0xffff);
    iVar9 = (int)local_38;
    local_48 = local_38 & 0xffffffff;
    if (iVar9 != 0) {
      pbVar16 = (byte *)(pFVar19->current).outline.tags;
      pbVar24 = pbVar16 + local_48;
      uVar17 = local_38;
      pbVar22 = pbVar21;
      local_58 = pbVar18;
      local_50 = pbVar24;
      local_40 = pFVar19;
      do {
        pbVar21 = pbVar22 + 1;
        if (pbVar18 < pbVar21) {
          return 0x14;
        }
        bVar1 = *pbVar22;
        __s = pbVar16 + 1;
        *pbVar16 = bVar1;
        if ((bVar1 & 8) != 0) {
          pbVar22 = pbVar22 + 2;
          if (pbVar18 < pbVar22) {
            return 0x14;
          }
          tmp = (FT_ULong)*pbVar21;
          if (pbVar24 < __s + tmp) {
            return 0x14;
          }
          pbVar21 = pbVar22;
          if (tmp != 0) {
            memset(__s,(uint)bVar1,tmp);
            __s = pbVar16 + (ulong)((int)tmp - 1U & 0xff) + 2;
            pbVar24 = local_50;
            uVar17 = local_38;
            pbVar18 = local_58;
            pFVar19 = local_40;
          }
        }
        iVar9 = (int)uVar17;
        pbVar22 = pbVar21;
        pbVar16 = __s;
      } while (__s < pbVar24);
    }
    if (pbVar21 <= pbVar18) {
      if (iVar9 != 0) {
        pFVar12 = (pFVar19->current).outline.points;
        pFVar13 = pFVar12 + local_48;
        pbVar24 = (byte *)(pFVar19->current).outline.tags;
        lVar15 = 0;
        do {
          bVar1 = *pbVar24;
          if ((bVar1 & 2) == 0) {
            if ((bVar1 & 0x10) == 0) {
              pbVar16 = pbVar21 + 2;
              iVar9 = 3;
              if (pbVar18 < pbVar16) goto LAB_002318c2;
              uVar17 = (long)(short)((ushort)*pbVar21 << 8) | (ulong)pbVar21[1];
            }
            else {
              pbVar16 = pbVar21;
              uVar17 = 0;
            }
LAB_002318af:
            lVar15 = lVar15 + uVar17;
            pFVar12->x = lVar15;
            *pbVar24 = bVar1 & 0xed;
            iVar9 = 0;
            pbVar21 = pbVar16;
          }
          else {
            pbVar16 = pbVar21 + 1;
            iVar9 = 3;
            if (pbVar16 <= pbVar18) {
              uVar17 = -(ulong)*pbVar21;
              if ((bVar1 & 0x10) != 0) {
                uVar17 = (ulong)*pbVar21;
              }
              goto LAB_002318af;
            }
          }
LAB_002318c2:
          if (iVar9 != 0) goto joined_r0x00231998;
          pFVar12 = pFVar12 + 1;
          pbVar24 = pbVar24 + 1;
        } while (pFVar12 < pFVar13);
      }
      if ((int)local_38 != 0) {
        pFVar13 = (pFVar19->current).outline.points;
        pFVar12 = pFVar13 + local_48;
        pbVar24 = (byte *)(pFVar19->current).outline.tags;
        lVar15 = 0;
        do {
          bVar1 = *pbVar24;
          if ((bVar1 & 4) == 0) {
            if ((bVar1 & 0x20) == 0) {
              iVar9 = 3;
              if (pbVar18 < pbVar21 + 2) goto LAB_00231965;
              pbVar16 = pbVar21 + 2;
              uVar17 = (long)(short)((ushort)*pbVar21 << 8) | (ulong)pbVar21[1];
            }
            else {
              pbVar16 = pbVar21;
              uVar17 = 0;
            }
LAB_00231951:
            lVar15 = lVar15 + uVar17;
            pFVar13->y = lVar15;
            *pbVar24 = bVar1 & 1;
            iVar9 = 0;
            pbVar21 = pbVar16;
          }
          else {
            pbVar16 = pbVar21 + 1;
            iVar9 = 3;
            if (pbVar16 <= pbVar18) {
              uVar17 = -(ulong)*pbVar21;
              if ((bVar1 & 0x20) != 0) {
                uVar17 = (ulong)*pbVar21;
              }
              goto LAB_00231951;
            }
          }
LAB_00231965:
          if (iVar9 != 0) {
joined_r0x00231998:
            if (iVar9 == 3) {
              return 0x14;
            }
            return FVar20;
          }
          pFVar13 = pFVar13 + 1;
          pbVar24 = pbVar24 + 1;
        } while (pFVar13 < pFVar12);
      }
      (pFVar19->current).outline.n_points = (short)local_38;
      (pFVar19->current).outline.n_contours = sVar2;
      load->cursor = pbVar21;
      return FVar20;
    }
  }
  return 0x14;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UShort)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & 8 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 2 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 16 ) == 0 )
          y = -y;
      }
      else if ( ( f & 16 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->x = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ~( 2 | 16 ) );
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 4 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 32 ) == 0 )
          y = -y;
      }
      else if ( ( f & 32 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->y = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & FT_CURVE_TAG_ON );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }